

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool P_SeekerMissile(AActor *actor,double thresh,double turnMax,bool precise,bool usecurspeed)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_b0;
  TAngle<double> local_a8;
  TVector2<double> local_a0;
  TVector2<double> local_90;
  double aimheight;
  double dist;
  TAngle<double> local_70;
  DAngle pitch;
  TAngle<double> local_60;
  TAngle<double> local_58;
  TFlags<ActorFlag,_unsigned_int> local_4c;
  double local_48;
  double speed;
  AActor *target;
  DAngle delta;
  int dir;
  bool usecurspeed_local;
  bool precise_local;
  double turnMax_local;
  double thresh_local;
  AActor *actor_local;
  
  delta.Degrees._6_1_ = usecurspeed;
  delta.Degrees._7_1_ = precise;
  TAngle<double>::TAngle((TAngle<double> *)&target);
  if ((delta.Degrees._6_1_ & 1) == 0) {
    local_b0 = actor->Speed;
  }
  else {
    local_b0 = AActor::VelToSpeed(actor);
  }
  local_48 = local_b0;
  speed = (double)TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->tracer);
  if (((AActor *)speed == (AActor *)0x0) || (bVar1 = AActor::CanSeek(actor,(AActor *)speed), !bVar1)
     ) {
    return false;
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_4c,
             SUB84(speed,0) +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
  if (uVar2 == 0) {
    TObjPtr<AActor>::operator=(&actor->tracer,(AActor *)0x0);
    return false;
  }
  if ((local_48 == 0.0) && (!NAN(local_48))) {
    return true;
  }
  delta.Degrees._0_4_ = P_FaceMobj(actor,(AActor *)speed,(DAngle *)&target);
  bVar1 = TAngle<double>::operator>((TAngle<double> *)&target,thresh);
  if (bVar1) {
    TAngle<double>::operator/=((TAngle<double> *)&target,2.0);
    bVar1 = TAngle<double>::operator>((TAngle<double> *)&target,turnMax);
    if (bVar1) {
      TAngle<double>::operator=((TAngle<double> *)&target,turnMax);
    }
  }
  if (delta.Degrees._0_4_ == 0) {
    TAngle<double>::TAngle(&local_60,(TAngle<double> *)&target);
    TAngle<double>::operator-=(&(actor->Angles).Yaw,&local_60);
  }
  else {
    TAngle<double>::TAngle(&local_58,(TAngle<double> *)&target);
    TAngle<double>::operator+=(&(actor->Angles).Yaw,&local_58);
  }
  if ((delta.Degrees._7_1_ & 1) == 0) {
    AActor::VelFromAngle(actor,local_48);
    operator|((EnumType)&pitch,MF3_FLOORHUGGER);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)((long)&pitch.Degrees + 4),&actor->flags3);
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pitch.Degrees + 4));
    if (uVar2 == 0) {
      dVar3 = AActor::Top(actor);
      dVar4 = AActor::Z((AActor *)speed);
      if (dVar4 <= dVar3) {
        dVar3 = AActor::Top((AActor *)speed);
        dVar4 = AActor::Z(actor);
        if (dVar4 <= dVar3) {
          return true;
        }
      }
      dVar3 = AActor::Center((AActor *)speed);
      dVar4 = AActor::Center(actor);
      dVar5 = AActor::DistanceBySpeed(actor,(AActor *)speed,local_48);
      (actor->Vel).Z = (dVar3 - dVar4) / dVar5;
    }
  }
  else {
    TAngle<double>::TAngle(&local_70,0.0);
    operator|((EnumType)&dist,MF3_FLOORHUGGER);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)((long)&dist + 4),&actor->flags3);
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&dist + 4));
    if (uVar2 == 0) {
      dVar3 = AActor::Distance2D(actor,(AActor *)speed,false);
      aimheight = MAX<double>(1.0,dVar3);
      local_90.Y = *(double *)((long)speed + 0x180) / 2.0;
      bVar1 = DObject::IsKindOf((DObject *)speed,APlayerPawn::RegistrationInfo.MyClass);
      dVar3 = aimheight;
      if (bVar1) {
        local_90.Y = *(double *)((long)speed + 0x500);
      }
      dVar4 = AActor::Z((AActor *)speed);
      dVar4 = dVar4 + local_90.Y;
      dVar5 = AActor::Center(actor);
      TVector2<double>::TVector2(&local_a0,dVar3,dVar4 - dVar5);
      TVector2<double>::Angle(&local_90);
      TAngle<double>::operator=(&local_70,(TAngle<double> *)&local_90);
    }
    TAngle<double>::operator-(&local_a8);
    AActor::Vel3DFromAngle(actor,&local_a8,local_48);
  }
  return true;
}

Assistant:

bool P_SeekerMissile (AActor *actor, double thresh, double turnMax, bool precise, bool usecurspeed)
{
	int dir;
	DAngle delta;
	AActor *target;
	double speed;

	speed = !usecurspeed ? actor->Speed : actor->VelToSpeed();
	target = actor->tracer;
	if (target == NULL || !actor->CanSeek(target))
	{
		return false;
	}
	if (!(target->flags & MF_SHOOTABLE))
	{ // Target died
		actor->tracer = NULL;
		return false;
	}
	if (speed == 0)
	{ // Technically, we're not seeking since our speed is 0, but the target *is* seekable.
		return true;
	}
	dir = P_FaceMobj (actor, target, &delta);
	if (delta > thresh)
	{
		delta /= 2;
		if (delta > turnMax)
		{
			delta = turnMax;
		}
	}
	if (dir)
	{ // Turn clockwise
		actor->Angles.Yaw += delta;
	}
	else
	{ // Turn counter clockwise
		actor->Angles.Yaw -= delta;
	}
	
	if (!precise)
	{
		actor->VelFromAngle(speed);

		if (!(actor->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER)))
		{
			if (actor->Top() < target->Z() ||
				target->Top() < actor->Z())
			{ // Need to seek vertically
				actor->Vel.Z = (target->Center() - actor->Center()) / actor->DistanceBySpeed(target, speed);
			}
		}
	}
	else
	{
		DAngle pitch = 0.;
		if (!(actor->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER)))
		{ // Need to seek vertically
			double dist = MAX(1., actor->Distance2D(target));
			// Aim at a player's eyes and at the middle of the actor for everything else.
			double aimheight = target->Height/2;
			if (target->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				aimheight = static_cast<APlayerPawn *>(target)->ViewHeight;
			}
			pitch = DVector2(dist, target->Z() + aimheight - actor->Center()).Angle();
		}
		actor->Vel3DFromAngle(-pitch, speed);
	}

	return true;
}